

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O0

void checkOptions(void)

{
  if (((*booleanOptions != 0) && (booleanOptions[1] != 0)) ||
     ((*booleanOptions == 0 && (booleanOptions[1] == 0)))) {
    fprintf(_stderr,"You must specify either -sat or -unsat\n");
    printUsage();
  }
  if (*intOptions < 1) {
    fprintf(_stderr,"You must specify num-of-variables to be at least 1\n");
    printUsage();
  }
  if ((booleanOptions[1] != 0) && (*stringOptions != (char *)0x0)) {
    fprintf(_stderr,
            "You have specified -unsat and -m, but no model can be created for an unsatisfiable instance\n"
           );
    printUsage();
  }
  return;
}

Assistant:

void checkOptions()
{
    if ( (booleanOptions[SAT] && booleanOptions[UNSAT])
        || (!booleanOptions[SAT] && !booleanOptions[UNSAT])
    )
    {
        fprintf (stderr, "You must specify either -sat or -unsat\n");
        printUsage();
    }

    if (intOptions[NUM_VARIABLES] <= 0)
    {
        fprintf (stderr, "You must specify num-of-variables to be at least 1\n");
        printUsage();
    }

    if (booleanOptions[UNSAT] && stringOptions[MODEL] != NULL)
    {
        fprintf (stderr, "You have specified -unsat and -m, but no model can be created for an unsatisfiable instance\n");
        printUsage();
    }
}